

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  uint uVar1;
  byte in_SIL;
  uint in_EDI;
  ImGuiItemFlags item_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = (GImGui->CurrentWindow->DC).ItemFlags;
  if ((in_SIL & 1) == 0) {
    uVar1 = (in_EDI ^ 0xffffffff) & uVar1;
  }
  else {
    uVar1 = in_EDI | uVar1;
  }
  (GImGui->CurrentWindow->DC).ItemFlags = uVar1;
  ImVector<int>::push_back
            ((ImVector<int> *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiItemFlags item_flags = window->DC.ItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    window->DC.ItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}